

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Nodes_ExtractInsert_Test::TestBody(Nodes_ExtractInsert_Test *this)

{
  char *pcVar1;
  string *psVar2;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  *this_00;
  uint uVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  *prVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 extraout_RAX;
  size_t sVar10;
  size_t sVar11;
  iterator *piVar12;
  slot_type *old_slot;
  slot_type *extraout_RDX;
  anon_union_8_1_a8a14541_for_iterator_1 extraout_RDX_00;
  iterator *extraout_RDX_01;
  iterator *extraout_RDX_02;
  iterator *extraout_RDX_03;
  iterator *extraout_RDX_04;
  iterator *value;
  iterator *extraout_RDX_05;
  iterator *value_00;
  byte bVar13;
  char *pcVar14;
  ctrl_t *pcVar15;
  size_t hashval;
  slot_type *psVar16;
  char *in_R9;
  pointer *__ptr;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  *this_01;
  pointer *__ptr_4;
  long lVar17;
  pointer *__ptr_5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  const_iterator it;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  StringTable t2;
  StringTable t;
  insert_return_type res;
  char k0 [28];
  node_type node;
  char k2 [27];
  char k1 [27];
  __m128i match;
  AssertHelper local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  undefined1 local_2d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  AssertHelper local_2b0 [2];
  undefined1 local_2a0 [8];
  anon_union_8_1_a8a14541_for_iterator_1 aStack_298;
  undefined1 local_290 [80];
  ctrl_t *local_240;
  undefined1 local_238 [24];
  size_t sStack_220;
  _Head_base<0UL,_unsigned_long,_false> local_210;
  undefined1 local_208 [24];
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  *prStack_1f0;
  _Head_base<0UL,_unsigned_long,_false> local_1e0;
  long local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  _Alloc_hider local_1a8;
  char *local_1a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  undefined1 local_108 [112];
  anon_union_8_1_a8a14541_for_iterator_1 local_98;
  undefined3 uStack_90;
  undefined5 local_8d;
  undefined3 uStack_88;
  char acStack_85 [13];
  char local_78 [32];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  local_108[0x10] = 't';
  local_108[0x11] = 'r';
  local_108[0x12] = 'i';
  local_108[0x13] = 'n';
  local_108[0x14] = 'g';
  local_108[0x15] = ' ';
  local_108[0x16] = 'z';
  local_108[0x17] = 'e';
  local_108[0x18] = 'r';
  local_108[0x19] = 'o';
  local_108[0x1a] = '.';
  local_108[0x1b] = '\0';
  local_108[0] = 'V';
  local_108[1] = 'e';
  local_108[2] = 'r';
  local_108[3] = 'y';
  local_108[4] = ' ';
  local_108[5] = 'l';
  local_108[6] = 'o';
  local_108[7] = 'n';
  local_108[8] = 'g';
  local_108[9] = ' ';
  local_108[10] = 's';
  local_108[0xb] = 't';
  local_108[0xc] = 'd';
  local_108[0xd] = ':';
  local_108[0xe] = ':';
  local_108[0xf] = 's';
  builtin_strncpy(local_78 + 0x10,"tring one.",0xb);
  builtin_strncpy(local_78,"Very long std::s",0x10);
  uStack_88 = 0x697274;
  builtin_strncpy(acStack_85,"ng two.",8);
  local_98 = (anon_union_8_1_a8a14541_for_iterator_1)0x6e6f6c2079726556;
  uStack_90 = 0x732067;
  local_8d = 0x733a3a6474;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[28],_const_char_(&)[1],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1c8,(char (*) [28])local_108,(char (*) [1])0x192918);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[1],_true>
            (&local_188,(char (*) [27])local_78,(char (*) [1])0x192918);
  pcVar14 = "";
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[1],_true>
            (&local_148,(char (*) [27])&local_98,(char (*) [1])0x192918);
  local_1e0._M_head_impl = 0;
  local_208._0_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffe08 = (undefined1  [16])0x0;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::
  insert<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_0>
            ((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)local_208,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1c8,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_108);
  lVar17 = -0xc0;
  paVar18 = &local_148.second.field_2;
  do {
    if (paVar18 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar18->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar18->_M_allocated_capacity)[-2],
                      paVar18->_M_allocated_capacity + 1);
    }
    if (&paVar18->_M_allocated_capacity + -4 != (size_type *)(&paVar18->_M_allocated_capacity)[-6])
    {
      operator_delete((size_type *)(&paVar18->_M_allocated_capacity)[-6],
                      (&paVar18->_M_allocated_capacity)[-4] + 1);
    }
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar18->_M_allocated_capacity + -8);
    lVar17 = lVar17 + 0x40;
  } while (lVar17 != 0);
  local_1c8._8_8_ = "";
  local_1b8._8_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  local_1a0 = "";
  local_1c8._0_8_ = &local_98;
  local_1b8._0_8_ = local_78;
  local_1a8._M_p = (pointer)local_108;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_2a0,local_1c8,(StringTable *)0x192c77);
  if (local_2a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = ((aStack_298.slot_)->pair).first._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_108 + 0x28),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c4,pcVar14);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_108 + 0x28),(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_108 + 0x28));
    if ((anon_union_8_1_a8a14541_for_iterator_1 *)local_1c8._0_8_ !=
        (anon_union_8_1_a8a14541_for_iterator_1 *)0x0) {
      (*(code *)((*(slot_type **)local_1c8._0_8_)->pair).first._M_string_length)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_298.slot_);
  }
  this_01 = (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
             *)local_208;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::extract<char[28],_0>((node_type *)(local_108 + 0x28),this_01,(key_arg<char[28]> *)local_108);
  pcVar14 = "";
  local_1c8._8_8_ = "";
  local_1b8._8_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  local_1c8._0_8_ = &local_98;
  local_1b8._0_8_ = local_78;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_2a0,local_1c8,(StringTable *)0x192c77);
  if (local_2a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = ((aStack_298.slot_)->pair).first._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c7,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_238,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_238);
    if ((anon_union_8_1_a8a14541_for_iterator_1 *)local_1c8._0_8_ !=
        (anon_union_8_1_a8a14541_for_iterator_1 *)0x0) {
      (*(code *)((*(slot_type **)local_1c8._0_8_)->pair).first._M_string_length)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_298.slot_);
  }
  local_2a0[0] = (internal)local_108[0x29];
  aStack_298.slot_ = (slot_type *)0x0;
  if (local_108[0x29] == '\0') {
    testing::Message::Message((Message *)local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c8,(internal *)local_2a0,(AssertionResult *)0x18a771,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c8,(char *)local_1c8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((anon_union_8_1_a8a14541_for_iterator_1 *)local_1c8._0_8_ !=
        (anon_union_8_1_a8a14541_for_iterator_1 *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
    }
    if ((AssertHelperData *)local_238._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_238._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_298.slot_);
  }
  local_2a0[0] = (internal)local_108[0x29];
  aStack_298.slot_ = (slot_type *)0x0;
  if (local_108[0x29] == '\0') {
    testing::Message::Message((Message *)local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c8,(internal *)local_2a0,(AssertionResult *)"node.empty()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c9,(char *)local_1c8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if ((anon_union_8_1_a8a14541_for_iterator_1 *)local_1c8._0_8_ !=
        (anon_union_8_1_a8a14541_for_iterator_1 *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
    }
    if ((AssertHelperData *)local_238._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_238._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_298.slot_);
  }
  local_210._M_head_impl = 0;
  local_238._0_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffdd8 = (undefined1  [16])0x0;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::insert((insert_return_type *)local_1c8,
           (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            *)local_238,(node_type *)(local_108 + 0x28));
  local_2d0[0] = (internal)local_1b8[0];
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1b8[0] == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_2d0,(AssertionResult *)"res.inserted","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6cd,(char *)local_2a0);
    testing::internal::AssertHelper::operator=(local_2b0,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(local_2b0);
    if (local_2a0 != (undefined1  [8])local_290) {
      operator_delete((void *)local_2a0,local_290._0_8_ + 1);
    }
    if ((long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) + 8))();
    }
  }
  if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c8,local_2c8);
  }
  pcVar14 = "";
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x192918;
  local_2d0 = (undefined1  [8])local_108;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::PairMatcher<char_const*,char_const*>>::operator()
            (local_2a0,local_2d0,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)"*res.position");
  if (local_2a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = ((aStack_298.slot_)->pair).first._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6ce,pcVar14);
    testing::internal::AssertHelper::operator=(&local_2e0,(Message *)local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    if (local_2d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2d0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_298.slot_);
  }
  local_2d0 = (undefined1  [8])(CONCAT71(local_2d0._1_7_,local_1b8[9]) ^ 1);
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1b8[9] != '\0') {
    testing::Message::Message((Message *)&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_2d0,(AssertionResult *)"res.node","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6cf,(char *)local_2a0);
    testing::internal::AssertHelper::operator=(local_2b0,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(local_2b0);
    if (local_2a0 != (undefined1  [8])local_290) {
      operator_delete((void *)local_2a0,local_290._0_8_ + 1);
    }
    if ((long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) + 8))();
    }
  }
  if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c8,local_2c8);
  }
  pcVar14 = "";
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x192918;
  local_2d0 = (undefined1  [8])local_108;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_2a0,local_2d0,(StringTable *)local_238);
  if (local_2a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = ((aStack_298.slot_)->pair).first._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d0,pcVar14);
    testing::internal::AssertHelper::operator=(&local_2e0,(Message *)local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    if (local_2d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2d0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_298.slot_);
  }
  pcVar14 = "";
  aStack_298.slot_ = (slot_type *)0x192918;
  local_290._8_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  local_2a0 = (undefined1  [8])&local_98;
  local_290._0_8_ = local_78;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_2d0,local_2a0,(StringTable *)0x192c77);
  if (local_2d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2a0);
    if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = (local_2c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d3,pcVar14);
    testing::internal::AssertHelper::operator=(&local_2e0,(Message *)local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    if (local_2a0 != (undefined1  [8])0x0) {
      (*(code *)((*(slot_type **)local_2a0)->pair).first._M_string_length)();
    }
  }
  if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c8,local_2c8);
  }
  uVar9 = std::_Hash_bytes("Not there!",10,0xc70f6907);
  old_slot = (slot_type *)0xde5fb9d2630458e9;
  local_240 = (ctrl_t *)local_208._0_8_;
  if ((ctrl_t *)local_208._0_8_ == (ctrl_t *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    prVar6 = prStack_1f0;
    if (((long)prStack_1f0 + 1U & (ulong)prStack_1f0) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar9;
    uVar9 = SUB168(auVar22 * ZEXT816(0xde5fb9d2630458e9),8) +
            SUB168(auVar22 * ZEXT816(0xde5fb9d2630458e9),0);
    uVar19 = (uVar9 >> 7 ^ (ulong)local_208._0_8_ >> 0xc) & (ulong)prStack_1f0;
    old_slot = (slot_type *)(uVar9 & 0xffffffffffffff7f);
    auVar22 = ZEXT416((CONCAT11((char)uVar9,(char)uVar9) & 0xff7f) & 0xffff7fff);
    auVar22 = pshuflw(auVar22,auVar22,0);
    local_58 = auVar22._0_4_;
    local_1d0 = 0;
    local_108._32_8_ = local_208._8_8_;
    psVar16 = (slot_type *)local_208._8_8_;
    uStack_54 = local_58;
    uStack_50 = local_58;
    uStack_4c = local_58;
    do {
      pcVar1 = local_240 + uVar19;
      local_48 = *pcVar1;
      cStack_47 = pcVar1[1];
      cStack_46 = pcVar1[2];
      cStack_45 = pcVar1[3];
      cStack_44 = pcVar1[4];
      cStack_43 = pcVar1[5];
      cStack_42 = pcVar1[6];
      cStack_41 = pcVar1[7];
      cStack_40 = pcVar1[8];
      cStack_3f = pcVar1[9];
      cStack_3e = pcVar1[10];
      cStack_3d = pcVar1[0xb];
      cStack_3c = pcVar1[0xc];
      cStack_3b = pcVar1[0xd];
      cStack_3a = pcVar1[0xe];
      cStack_39 = pcVar1[0xf];
      auVar23[0] = -((char)local_58 == local_48);
      auVar23[1] = -(local_58._1_1_ == cStack_47);
      auVar23[2] = -(local_58._2_1_ == cStack_46);
      auVar23[3] = -(local_58._3_1_ == cStack_45);
      auVar23[4] = -((char)uStack_54 == cStack_44);
      auVar23[5] = -(uStack_54._1_1_ == cStack_43);
      auVar23[6] = -(uStack_54._2_1_ == cStack_42);
      auVar23[7] = -(uStack_54._3_1_ == cStack_41);
      auVar23[8] = -((char)uStack_50 == cStack_40);
      auVar23[9] = -(uStack_50._1_1_ == cStack_3f);
      auVar23[10] = -(uStack_50._2_1_ == cStack_3e);
      auVar23[0xb] = -(uStack_50._3_1_ == cStack_3d);
      auVar23[0xc] = -((char)uStack_4c == cStack_3c);
      auVar23[0xd] = -(uStack_4c._1_1_ == cStack_3b);
      auVar23[0xe] = -(uStack_4c._2_1_ == cStack_3a);
      auVar23[0xf] = -(uStack_4c._3_1_ == cStack_39);
      uVar5 = (ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe | (ushort)(auVar23[0xf] >> 7) << 0xf;
      bVar20 = uVar5 == 0;
      if (!bVar20) {
        uVar8 = (uint)uVar5;
        bVar20 = false;
        do {
          uVar3 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          this_01 = (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                     *)(uVar3 + uVar19 & (ulong)prVar6);
          old_slot = (slot_type *)psVar16[(long)this_01].pair.first._M_string_length;
          if (old_slot == (slot_type *)0xa) {
            iVar7 = bcmp(psVar16[(long)this_01].pair.first._M_dataplus._M_p,"Not there!",10);
            bVar21 = iVar7 == 0;
            old_slot = extraout_RDX;
            psVar16 = (slot_type *)local_108._32_8_;
          }
          else {
            bVar21 = false;
          }
          pcVar14 = (char *)(ulong)(byte)((byte)pcVar14 | bVar21);
          if (bVar21 != false) goto LAB_0013b5d6;
          uVar8 = uVar8 - 1 & uVar8;
          bVar20 = uVar8 == 0;
        } while (!bVar20);
        bVar20 = true;
      }
LAB_0013b5d6:
      if (bVar20) {
        auVar24[0] = -(local_48 == -0x80);
        auVar24[1] = -(cStack_47 == -0x80);
        auVar24[2] = -(cStack_46 == -0x80);
        auVar24[3] = -(cStack_45 == -0x80);
        auVar24[4] = -(cStack_44 == -0x80);
        auVar24[5] = -(cStack_43 == -0x80);
        auVar24[6] = -(cStack_42 == -0x80);
        auVar24[7] = -(cStack_41 == -0x80);
        auVar24[8] = -(cStack_40 == -0x80);
        auVar24[9] = -(cStack_3f == -0x80);
        auVar24[10] = -(cStack_3e == -0x80);
        auVar24[0xb] = -(cStack_3d == -0x80);
        auVar24[0xc] = -(cStack_3c == -0x80);
        auVar24[0xd] = -(cStack_3b == -0x80);
        auVar24[0xe] = -(cStack_3a == -0x80);
        auVar24[0xf] = -(cStack_39 == -0x80);
        if ((((((((((((((((auVar24 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar24 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar24 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar24 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar24 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar24 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar24 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar24 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar24 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar24 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar24 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar24 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar24[0xf]
           ) {
          lVar17 = uVar19 + local_1d0;
          local_1d0 = local_1d0 + 0x10;
          uVar19 = lVar17 + 0x10U & (ulong)prVar6;
          bVar20 = true;
        }
        else {
          bVar20 = false;
          pcVar14 = (char *)0x0;
        }
      }
      else {
        bVar20 = false;
      }
    } while (bVar20);
  }
  if ((((ulong)pcVar14 & 1) == 0) || (this_01 == prStack_1f0)) {
    local_2a0[1] = 0;
  }
  else {
    pcVar15 = local_240 + (long)this_01;
    local_2a0[1] = true;
    hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
    transfer<std::allocator<int>>
              ((allocator<int> *)&aStack_298,(slot_type *)(local_208._8_8_ + this_01 * 0x40),
               old_slot);
    it.inner_.field_1.slot_ = extraout_RDX_00.slot_;
    it.inner_.ctrl_ = pcVar15;
    raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
    ::erase_meta_only((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                       *)local_208,it);
  }
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::operator=((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               *)(local_108 + 0x28),
              (node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               *)local_2a0);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
             *)local_2a0);
  pcVar14 = "";
  aStack_298.slot_ = (slot_type *)0x192918;
  local_290._8_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  local_2a0 = (undefined1  [8])&local_98;
  local_290._0_8_ = local_78;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_2d0,local_2a0,(StringTable *)0x192c77);
  if (local_2d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2a0);
    if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = (local_2c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d5,pcVar14);
    testing::internal::AssertHelper::operator=(&local_2e0,(Message *)local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    if (local_2a0 != (undefined1  [8])0x0) {
      (*(code *)((*(slot_type **)local_2a0)->pair).first._M_string_length)();
    }
  }
  if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c8,local_2c8);
  }
  local_2d0 = (undefined1  [8])(CONCAT71(local_2d0._1_7_,local_108[0x29]) ^ 1);
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_108[0x29] != '\0') {
    testing::Message::Message((Message *)&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_2d0,(AssertionResult *)0x18a771,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d6,(char *)local_2a0);
    testing::internal::AssertHelper::operator=(local_2b0,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(local_2b0);
    if (local_2a0 != (undefined1  [8])local_290) {
      operator_delete((void *)local_2a0,(ulong)(local_290._0_8_ + 1));
    }
    if ((long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) + 8))();
    }
  }
  if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c8,local_2c8);
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::insert((insert_return_type *)local_2a0,
           (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            *)local_238,(node_type *)(local_108 + 0x28));
  this_00 = (node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
             *)(local_1b8 + 8);
  local_1b8[0] = local_290[0];
  local_1c8._0_8_ = local_2a0;
  local_1c8._8_8_ = aStack_298;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::operator=(this_00,(node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                       *)(local_290 + 8));
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
             *)(local_290 + 8));
  if (local_290[9] == '\x01') {
    local_290[9] = 0;
  }
  piVar12 = (iterator *)(CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1b8[0]) & 0xffffffff ^ 1);
  local_2d0[0] = (internal)(char)piVar12;
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  value = extraout_RDX_01;
  if (local_1b8[0] != '\0') {
    testing::Message::Message((Message *)&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_2d0,(AssertionResult *)"res.inserted","true",
               "false",in_R9);
    piVar12 = (iterator *)0x6da;
    testing::internal::AssertHelper::AssertHelper
              (local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6da,(char *)local_2a0);
    testing::internal::AssertHelper::operator=(local_2b0,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(local_2b0);
    value = extraout_RDX_02;
    if (local_2a0 != (undefined1  [8])local_290) {
      operator_delete((void *)local_2a0,(ulong)(local_290._0_8_ + 1));
      value = extraout_RDX_03;
    }
    if ((long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) + 8))();
      value = extraout_RDX_04;
    }
  }
  if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c8,local_2c8);
    value = extraout_RDX_05;
  }
  local_2b0[0].data_ = (AssertHelperData *)((long)(Type *)local_238._0_8_ + sStack_220);
  if ((AssertHelperData *)local_1c8._0_8_ == local_2b0[0].data_) {
    testing::AssertionSuccess();
  }
  else {
    testing::internal::
    FormatForComparisonFailureMessage<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator,phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator>
              ((string *)local_2a0,(internal *)local_1c8,value,piVar12);
    testing::internal::
    FormatForComparisonFailureMessage<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator,phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator>
              ((string *)local_2d0,(internal *)local_2b0,value_00,piVar12);
    in_R9 = (char *)0x0;
    testing::internal::EqFailure
              ((internal *)&local_2e0,"res.position","t2.end()",(string *)local_2a0,
               (string *)local_2d0,false);
    if (local_2d0 != (undefined1  [8])&local_2c0) {
      operator_delete((void *)local_2d0,local_2c0._M_allocated_capacity + 1);
    }
    if (local_2a0 != (undefined1  [8])local_290) {
      operator_delete((void *)local_2a0,(ulong)(local_290._0_8_ + 1));
    }
  }
  if (local_2e0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_2a0);
    if (local_2d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (local_2d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6db,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2d0,(Message *)local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2d0);
    if (local_2a0 != (undefined1  [8])0x0) {
      (*(code *)((*(slot_type **)local_2a0)->pair).first._M_string_length)();
    }
  }
  if (local_2d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,local_2d8);
  }
  local_2d0 = (undefined1  [8])(CONCAT71(local_2d0._1_7_,local_1b8[9]) ^ 1);
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1b8[9] != '\0') {
    testing::Message::Message((Message *)&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_2d0,(AssertionResult *)"res.node","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6dc,(char *)local_2a0);
    testing::internal::AssertHelper::operator=(local_2b0,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(local_2b0);
    if (local_2a0 != (undefined1  [8])local_290) {
      operator_delete((void *)local_2a0,(ulong)(local_290._0_8_ + 1));
    }
    if ((long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) + 8))();
    }
  }
  if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c8,local_2c8);
  }
  local_2d0 = (undefined1  [8])local_108;
  pcVar14 = "";
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x192918;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_2a0,local_2d0,(StringTable *)local_238);
  if (local_2a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = ((aStack_298.slot_)->pair).first._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6dd,pcVar14);
    testing::internal::AssertHelper::operator=(&local_2e0,(Message *)local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    if (local_2d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2d0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_298.slot_);
  }
  local_2a0 = (undefined1  [8])strlen((char *)local_108);
  aStack_298.slot_ = (slot_type *)local_108;
  uVar9 = std::_Hash_bytes((slot_type *)local_108,(ulong)local_2a0,0xc70f6907);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar9;
  hashval = SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),8) +
            SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),0);
  sVar10 = raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
           ::_find_key<std::basic_string_view<char,std::char_traits<char>>>
                     ((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
                       *)local_208,(basic_string_view<char,_std::char_traits<char>_> *)local_2a0,
                      hashval);
  if (sVar10 == 0xffffffffffffffff) {
    sVar10 = raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
             ::prepare_insert((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                               *)local_208,hashval);
    psVar2 = (string *)(local_208._8_8_ + sVar10 * 0x40);
    (((slot_type *)(local_208._8_8_ + sVar10 * 0x40))->pair).first._M_dataplus._M_p =
         (pointer)&(((slot_type *)(local_208._8_8_ + sVar10 * 0x40))->pair).first.field_2;
    sVar11 = strlen(local_108);
    std::__cxx11::string::_M_construct<char_const*>(psVar2,local_108,local_108 + sVar11);
    *(string **)(psVar2 + 0x20) = psVar2 + 0x30;
    *(undefined2 *)(psVar2 + 0x30) = 0x31;
    *(undefined8 *)(psVar2 + 0x28) = 1;
    if (prStack_1f0 <= sVar10) {
      __assert_fail("i < capacity_",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x8fb,
                    "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::StringPolicy, phmap::priv::(anonymous namespace)::StringHash, phmap::priv::(anonymous namespace)::StringEq, std::allocator<int>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::(anonymous namespace)::StringPolicy, Hash = phmap::priv::(anonymous namespace)::StringHash, Eq = phmap::priv::(anonymous namespace)::StringEq, Alloc = std::allocator<int>]"
                   );
    }
    bVar13 = (byte)hashval & 0x7f;
    *(byte *)(local_208._0_8_ + sVar10) = bVar13;
    *(byte *)(local_208._0_8_ +
             (ulong)(local_208._24_4_ & 0xf) + 1 + (sVar10 - 0x10 & (ulong)prStack_1f0)) = bVar13;
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::extract<char[28],_0>
            ((node_type *)local_2a0,
             (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)local_208,(key_arg<char[28]> *)local_108);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::operator=((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               *)(local_108 + 0x28),
              (node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               *)local_2a0);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
             *)local_2a0);
  if ((bool)local_2a0[1] == true) {
    local_2a0[1] = 0;
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::insert((insert_return_type *)local_2a0,
           (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            *)local_238,(node_type *)(local_108 + 0x28));
  local_1b8[0] = local_290[0];
  local_1c8._0_8_ = local_2a0;
  local_1c8._8_8_ = aStack_298;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::operator=(this_00,(node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
                       *)(local_290 + 8));
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
             *)(local_290 + 8));
  if (local_290[9] == '\x01') {
    local_290[9] = 0;
  }
  local_2d0 = (undefined1  [8])(CONCAT71(local_2d0._1_7_,local_1b8[0]) ^ 1);
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1b8[0] != '\0') {
    testing::Message::Message((Message *)&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_2d0,(AssertionResult *)"res.inserted","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e4,(char *)local_2a0);
    testing::internal::AssertHelper::operator=(local_2b0,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(local_2b0);
    if (local_2a0 != (undefined1  [8])local_290) {
      operator_delete((void *)local_2a0,(ulong)(local_290._0_8_ + 1));
    }
    if ((long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) + 8))();
    }
  }
  if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c8,local_2c8);
  }
  pcVar14 = "";
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x192918;
  local_2d0 = (undefined1  [8])local_108;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::PairMatcher<char_const*,char_const*>>::operator()
            (local_2a0,local_2d0,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)"*res.position");
  if (local_2a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = ((aStack_298.slot_)->pair).first._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e5,pcVar14);
    testing::internal::AssertHelper::operator=(&local_2e0,(Message *)local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    if (local_2d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2d0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_298.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_298.slot_);
  }
  local_2d0[0] = (internal)local_1b8[9];
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1b8[9] == '\0') {
    testing::Message::Message((Message *)&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_2d0,(AssertionResult *)"res.node","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e6,(char *)local_2a0);
    testing::internal::AssertHelper::operator=(local_2b0,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(local_2b0);
    if (local_2a0 != (undefined1  [8])local_290) {
      operator_delete((void *)local_2a0,(ulong)(local_290._0_8_ + 1));
    }
    if ((long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) + 8))();
    }
  }
  if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c8,local_2c8);
  }
  local_2d0 = (undefined1  [8])(CONCAT71(local_2d0._1_7_,local_108[0x29]) ^ 1);
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_108[0x29] == '\x01') {
    testing::Message::Message((Message *)&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_2d0,(AssertionResult *)0x18a771,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e7,(char *)local_2a0);
    testing::internal::AssertHelper::operator=(local_2b0,(Message *)&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(local_2b0);
    if (local_2a0 != (undefined1  [8])local_290) {
      operator_delete((void *)local_2a0,(ulong)(local_290._0_8_ + 1));
    }
    if ((long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2e0.data_._1_7_,local_2e0.data_._0_1_) + 8))();
    }
  }
  if (local_2c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c8,local_2c8);
  }
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy(this_00);
  if (local_1b8[9] == '\x01') {
    local_1b8[9] = 0;
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::destroy_slots((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                   *)local_238);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
             *)(local_108 + 0x28));
  if (local_108[0x29] == '\x01') {
    local_108[0x29] = '\0';
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::destroy_slots((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                   *)local_208);
  return;
}

Assistant:

TEST(Nodes, ExtractInsert) {
  constexpr char k0[] = "Very long std::string zero.";
  constexpr char k1[] = "Very long std::string one.";
  constexpr char k2[] = "Very long std::string two.";
  StringTable t = {{k0, ""}, {k1, ""}, {k2, ""}};
  EXPECT_THAT(t,
              UnorderedElementsAre(Pair(k0, ""), Pair(k1, ""), Pair(k2, "")));

  auto node = t.extract(k0);
  EXPECT_THAT(t, UnorderedElementsAre(Pair(k1, ""), Pair(k2, "")));
  EXPECT_TRUE(node);
  EXPECT_FALSE(node.empty());

  StringTable t2;
  StringTable::insert_return_type res = t2.insert(std::move(node));
  EXPECT_TRUE(res.inserted);
  EXPECT_THAT(*res.position, Pair(k0, ""));
  EXPECT_FALSE(res.node);
  EXPECT_THAT(t2, UnorderedElementsAre(Pair(k0, "")));

  // Not there.
  EXPECT_THAT(t, UnorderedElementsAre(Pair(k1, ""), Pair(k2, "")));
  node = t.extract("Not there!");
  EXPECT_THAT(t, UnorderedElementsAre(Pair(k1, ""), Pair(k2, "")));
  EXPECT_FALSE(node);

  // Inserting nothing.
  res = t2.insert(std::move(node));
  EXPECT_FALSE(res.inserted);
  EXPECT_EQ(res.position, t2.end());
  EXPECT_FALSE(res.node);
  EXPECT_THAT(t2, UnorderedElementsAre(Pair(k0, "")));

  t.emplace(k0, "1");
  node = t.extract(k0);

  // Insert duplicate.
  res = t2.insert(std::move(node));
  EXPECT_FALSE(res.inserted);
  EXPECT_THAT(*res.position, Pair(k0, ""));
  EXPECT_TRUE(res.node);
  EXPECT_FALSE(node);
}